

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

int mdns_socket_setup_ipv6(int sock)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint loopback;
  int hops;
  ipv6_mreq req;
  sockaddr_in6 saddr;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  sockaddr local_38;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  
  uStack_20 = 0;
  local_38.sa_family = 10;
  local_38.sa_data[0] = '\0';
  local_38.sa_data[1] = '\0';
  local_38.sa_data[2] = '\0';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\0';
  local_38.sa_data._6_4_ = SUB84(_in6addr_any,0);
  local_38.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
  uStack_28 = (undefined4)_poll;
  uStack_24 = (undefined4)((ulong)_poll >> 0x20);
  iVar1 = bind(sock,&local_38,0x1c);
  iVar3 = -1;
  if (iVar1 == 0) {
    uVar2 = fcntl(sock,3,0);
    fcntl(sock,4,(ulong)(uVar2 | 0x800));
    local_5c = 1;
    local_60 = 1;
    setsockopt(sock,0x29,0x12,&local_5c,4);
    setsockopt(sock,0x29,0x13,&local_60,4);
    local_48 = 0;
    local_58 = 0x2ff;
    uStack_50 = 0xfb00000000000000;
    iVar3 = setsockopt(sock,0x29,0x14,&local_58,0x14);
    iVar3 = -(uint)(iVar3 != 0);
  }
  return iVar3;
}

Assistant:

int
mdns_socket_setup_ipv6(int sock) {
	struct sockaddr_in6 saddr;
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin6_family = AF_INET6;
	saddr.sin6_addr = in6addr_any;
#ifdef __APPLE__
	saddr.sin6_len = sizeof(saddr);
#endif

	if (bind(sock, (struct sockaddr*)&saddr, sizeof(saddr)))
		return -1;

#ifdef _WIN32
	unsigned long param = 1;
	ioctlsocket(sock, FIONBIO, &param);
#else
	const int flags = fcntl(sock, F_GETFL, 0);
	fcntl(sock, F_SETFL, flags | O_NONBLOCK);
#endif

	int hops = 1;
	unsigned int loopback = 1;
	struct ipv6_mreq req;

	setsockopt(sock, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, (const char*)&hops, sizeof(hops));
	setsockopt(sock, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, (const char*)&loopback, sizeof(loopback));

	memset(&req, 0, sizeof(req));
	req.ipv6mr_multiaddr.s6_addr[0] = 0xFF;
	req.ipv6mr_multiaddr.s6_addr[1] = 0x02;
	req.ipv6mr_multiaddr.s6_addr[15] = 0xFB;
	if (setsockopt(sock, IPPROTO_IPV6, IPV6_JOIN_GROUP, (char*)&req, sizeof(req)))
		return -1;

	return 0;
}